

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::OP_LdElementUndefined<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementU<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout)

{
  bool bVar1;
  PropertyId PVar2;
  ScriptContext *scriptContext;
  Var pvVar3;
  OpLayoutT_ElementU<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  bVar1 = ParseableFunctionInfo::IsEval(*(ParseableFunctionInfo **)(this + 0x88));
  if (bVar1) {
    pvVar3 = GetReg<unsigned_char>(this,playout->Instance);
    PVar2 = FunctionBody::GetReferencedPropertyId
                      (*(FunctionBody **)(this + 0x88),(uint)playout->PropertyIdIndex);
    scriptContext = GetScriptContext(this);
    Js::JavascriptOperators::OP_LoadUndefinedToElementDynamic(pvVar3,PVar2,scriptContext);
  }
  else {
    pvVar3 = GetReg<unsigned_char>(this,playout->Instance);
    PVar2 = FunctionBody::GetReferencedPropertyId
                      (*(FunctionBody **)(this + 0x88),(uint)playout->PropertyIdIndex);
    Js::JavascriptOperators::OP_LoadUndefinedToElement(pvVar3,PVar2);
  }
  return;
}

Assistant:

void InterpreterStackFrame::OP_LdElementUndefined(const unaligned OpLayoutT_ElementU<T>* playout)
    {
        if (this->m_functionBody->IsEval())
        {
            JavascriptOperators::OP_LoadUndefinedToElementDynamic(GetReg(playout->Instance),
                this->m_functionBody->GetReferencedPropertyId(playout->PropertyIdIndex), GetScriptContext());
        }
        else
        {
            JavascriptOperators::OP_LoadUndefinedToElement(GetReg(playout->Instance),
                this->m_functionBody->GetReferencedPropertyId(playout->PropertyIdIndex));
        }
    }